

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

void __thiscall cmTarget::MaybeInvalidatePropertyCache(cmTarget *this,string *prop)

{
  pointer pcVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  long *local_68 [2];
  long local_58 [2];
  long *local_48 [2];
  long local_38 [2];
  
  bVar4 = this->IsImportedTarget;
  if (bVar4 == true) {
    pcVar1 = (prop->_M_dataplus)._M_p;
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,pcVar1,pcVar1 + prop->_M_string_length);
    iVar2 = strncmp((char *)local_48[0],"IMPORTED",8);
    bVar3 = iVar2 == 0;
  }
  else {
    bVar3 = false;
  }
  if ((bVar4 != false) && (local_48[0] != local_38)) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  if (bVar3) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::ImportInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::ImportInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::ImportInfo>_>_>
    ::clear(&(((this->Internal).Pointer)->ImportInfoMap)._M_t);
  }
  if (this->IsImportedTarget == false) {
    local_68[0] = local_58;
    pcVar1 = (prop->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_68,pcVar1,pcVar1 + prop->_M_string_length);
    iVar2 = strncmp((char *)local_68[0],"LINK_INTERFACE_",0xf);
    bVar4 = iVar2 == 0;
    if (local_68[0] != local_58) {
      operator_delete(local_68[0],local_58[0] + 1);
    }
  }
  else {
    bVar4 = false;
  }
  if (bVar4) {
    ClearLinkMaps(this);
  }
  return;
}

Assistant:

void cmTarget::MaybeInvalidatePropertyCache(const std::string& prop)
{
  // Wipe out maps caching information affected by this property.
  if(this->IsImported() && cmHasLiteralPrefix(prop, "IMPORTED"))
    {
    this->Internal->ImportInfoMap.clear();
    }
  if(!this->IsImported() && cmHasLiteralPrefix(prop, "LINK_INTERFACE_"))
    {
    this->ClearLinkMaps();
    }
}